

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

bool __thiscall
ICM::Compiler::PreliminaryCompile::adjustNode(PreliminaryCompile *this,Node *node,size_t begin)

{
  Element *pEVar1;
  Element *e;
  Element *elt;
  
  elt = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
        super__Vector_impl_data._M_start + begin;
  pEVar1 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (elt < pEVar1) {
    do {
      adjustElement(this,elt);
      elt = elt + 1;
    } while (elt != pEVar1);
  }
  return true;
}

Assistant:

bool adjustNode(Node &node, size_t begin = 0) {
				for (Element &e : rangei(node.begin() + begin, node.end())) {
					adjustElement(e);
				}
				return true;
			}